

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O3

void __thiscall
wasm::LocalGraphFlower::computeSetInfluences
          (LocalGraphFlower *this,LocalSet *set,SetInfluencesMap *setInfluences)

{
  uint uVar1;
  pointer pvVar2;
  pointer ppLVar3;
  pointer pvVar4;
  pointer ppLVar5;
  bool bVar6;
  __hashtable *__h;
  const_iterator cVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  pointer ppLVar10;
  pointer ppLVar11;
  _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_a8;
  LocalSet *local_a0;
  LocalSet *set_local;
  LocalGet *get_1;
  Iterator ret_1;
  LocalSet *set_2;
  undefined1 local_58 [8];
  LocalGet *get;
  size_t local_48;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_40;
  LocalGraphFlower *local_38;
  
  uVar1 = set->index;
  local_a0 = set;
  cVar7 = std::
          _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&setInfluences->_M_h,&local_a0);
  if (cVar7.
      super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pvVar2 = (this->getsByIndex).
             super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppLVar10 = pvVar2[uVar1].super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar3 = *(pointer *)
               ((long)&pvVar2[uVar1].
                       super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                       _M_impl.super__Vector_impl_data + 8);
    local_38 = this;
    if (ppLVar10 != ppLVar3) {
      do {
        local_58 = (undefined1  [8])*ppLVar10;
        cVar8 = std::
                _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&local_38->getSetsMap->_M_h,(key_type *)local_58);
        if (cVar8.
            super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          computeGetSets(local_38,(LocalGet *)local_58);
        }
        ppLVar10 = ppLVar10 + 1;
      } while (ppLVar10 != ppLVar3);
    }
    pvVar4 = (local_38->setsByIndex).
             super__Vector_base<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppLVar11 = pvVar4[uVar1].super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = *(pointer *)
               ((long)&pvVar4[uVar1].
                       super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                       _M_impl.super__Vector_impl_data + 8);
    if (ppLVar11 != ppLVar5) {
      do {
        local_58 = (undefined1  [8])*ppLVar11;
        std::__detail::
        _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)setInfluences,(key_type *)local_58);
        ppLVar11 = ppLVar11 + 1;
      } while (ppLVar11 != ppLVar5);
    }
    std::__detail::
    _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)setInfluences,&local_a0);
    pvVar2 = (local_38->getsByIndex).
             super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppLVar10 = pvVar2[uVar1].super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar3 = *(pointer *)
               ((long)&pvVar2[uVar1].
                       super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                       _M_impl.super__Vector_impl_data + 8);
    if (ppLVar10 != ppLVar3) {
      do {
        set_local = (LocalSet *)*ppLVar10;
        get_1 = (LocalGet *)
                std::__detail::
                _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_38->getSetsMap,(key_type *)&set_local);
        ret_1.parent._0_1_ =
             (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)get_1)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
        local_40._M_node = (_Base_ptr)0x0;
        local_58 = (undefined1  [8])get_1;
        get._0_1_ = ret_1.parent._0_1_;
        if ((bool)ret_1.parent._0_1_) {
          local_48 = 0;
          ret_1.fixedIndex = 0;
          ret_1._8_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           *)&((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                *)get_1)->fixed)->fixed).
                        super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
        }
        else {
          local_40._M_node =
               (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  *)get_1)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ret_1.fixedIndex =
               (size_t)&(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           *)get_1)->flexible)._M_t._M_impl.super__Rb_tree_header;
        }
        while( true ) {
          bVar6 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ::
                  IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                  ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                *)local_58,(Iterator *)&get_1);
          if (bVar6) break;
          p_Var9 = local_40._M_node + 1;
          if ((char)get != '\0') {
            p_Var9 = (_Base_ptr)
                     ((((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         *)local_58)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                      _M_elems + local_48);
          }
          ret_1.flexibleIterator._M_node = *(_Base_ptr *)p_Var9;
          local_a8 = (_Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)std::__detail::
                        _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)setInfluences,(key_type *)&ret_1.flexibleIterator);
          std::
          _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::LocalGet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalGet*,false>>>>
                    (local_a8,&set_local,&local_a8);
          if ((char)get == '\x01') {
            local_48 = local_48 + 1;
          }
          else {
            local_40._M_node = (_Base_ptr)std::_Rb_tree_increment(local_40._M_node);
          }
        }
        ppLVar10 = ppLVar10 + 1;
      } while (ppLVar10 != ppLVar3);
    }
    return;
  }
  __assert_fail("!setInfluences.count(set)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,0x19c,
                "void wasm::LocalGraphFlower::computeSetInfluences(LocalSet *, LocalGraphBase::SetInfluencesMap &)"
               );
}

Assistant:

void computeSetInfluences(LocalSet* set,
                            LocalGraphBase::SetInfluencesMap& setInfluences) {
    auto index = set->index;

    // We must never repeat work.
    assert(!setInfluences.count(set));

    // In theory we could flow the set forward, but to keep things simple we
    // reuse the logic for flowing gets backwards: We flow all the gets of the
    // set's index, thus fully computing that index and all its sets, including
    // this one. This is not 100% lazy, but still avoids extra work by never
    // doing work for local indexes we don't care about.
    for (auto* get : getsByIndex[index]) {
      // Don't repeat work.
      if (!getSetsMap.count(get)) {
        computeGetSets(get);
      }
    }

    // Ensure empty entries for each set of this index, to mark them as
    // computed.
    for (auto* set : setsByIndex[index]) {
      setInfluences[set];
    }

    // Also ensure |set| itself, that we were originally asked about. It may be
    // in unreachable code, which means it is not listed in setsByIndex.
    setInfluences[set];

    // Apply the info from the gets to the sets.
    for (auto* get : getsByIndex[index]) {
      for (auto* set : getSetsMap[get]) {
        setInfluences[set].insert(get);
      }
    }
  }